

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

int Wlc_NtkMemUsage(Wlc_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int Mem;
  Wlc_Ntk_t *p_local;
  
  iVar1 = (p->vPis).nCap;
  iVar2 = (p->vPos).nCap;
  iVar3 = (p->vCis).nCap;
  iVar4 = (p->vCos).nCap;
  iVar5 = (p->vFfs).nCap;
  iVar6 = p->nObjsAlloc;
  iVar7 = Abc_NamMemUsed(p->pManName);
  iVar8 = Mem_FlexReadMemUsage(p->pMemFanin);
  return iVar8 + iVar7 + iVar5 * 4 + iVar4 * 4 + iVar3 * 4 + iVar2 * 4 + iVar1 * 4 + 600 +
                         iVar6 * 0x18;
}

Assistant:

int Wlc_NtkMemUsage( Wlc_Ntk_t * p )
{
    int Mem = sizeof(Wlc_Ntk_t);
    Mem += 4 * p->vPis.nCap;
    Mem += 4 * p->vPos.nCap;
    Mem += 4 * p->vCis.nCap;
    Mem += 4 * p->vCos.nCap;
    Mem += 4 * p->vFfs.nCap;
    Mem += sizeof(Wlc_Obj_t) * p->nObjsAlloc;
    Mem += Abc_NamMemUsed(p->pManName);
    Mem += Mem_FlexReadMemUsage(p->pMemFanin);
    return Mem;
}